

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outqueue.c
# Opt level: O0

lzma_ret lzma_outq_init(lzma_outq *outq,lzma_allocator *allocator,uint64_t buf_size_max,
                       uint32_t threads)

{
  _func_void_ptr_void_ptr_size_t_size_t *p_Var1;
  _func_void_void_ptr_void_ptr *p_Var2;
  uint local_3c;
  lzma_ret ret_;
  uint32_t bufs_count;
  uint64_t bufs_alloc_size;
  void *pvStack_28;
  uint32_t threads_local;
  uint64_t buf_size_max_local;
  lzma_allocator *allocator_local;
  lzma_outq *outq_local;
  
  bufs_alloc_size._4_4_ = threads;
  pvStack_28 = (void *)buf_size_max;
  buf_size_max_local = (uint64_t)allocator;
  allocator_local = (lzma_allocator *)outq;
  outq_local._4_4_ = get_options((uint64_t *)&ret_,&local_3c,buf_size_max,threads);
  if (outq_local._4_4_ == LZMA_OK) {
    if ((allocator_local->opaque != pvStack_28) || (*(uint *)&allocator_local[1].alloc != local_3c))
    {
      lzma_outq_end((lzma_outq *)allocator_local,(lzma_allocator *)buf_size_max_local);
      p_Var1 = (_func_void_ptr_void_ptr_size_t_size_t *)
               lzma_alloc((ulong)local_3c * 0x28,(lzma_allocator *)buf_size_max_local);
      allocator_local->alloc = p_Var1;
      p_Var2 = (_func_void_void_ptr_void_ptr *)
               lzma_alloc(_ret_,(lzma_allocator *)buf_size_max_local);
      allocator_local->free = p_Var2;
      if ((allocator_local->alloc == (_func_void_ptr_void_ptr_size_t_size_t *)0x0) ||
         (allocator_local->free == (_func_void_void_ptr_void_ptr *)0x0)) {
        lzma_outq_end((lzma_outq *)allocator_local,(lzma_allocator *)buf_size_max_local);
        return LZMA_MEM_ERROR;
      }
    }
    allocator_local->opaque = pvStack_28;
    *(uint *)&allocator_local[1].alloc = local_3c;
    *(undefined4 *)((long)&allocator_local[1].alloc + 4) = 0;
    *(undefined4 *)&allocator_local[1].free = 0;
    allocator_local[1].opaque = (void *)0x0;
    outq_local._4_4_ = LZMA_OK;
  }
  return outq_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_outq_init(lzma_outq *outq, const lzma_allocator *allocator,
		uint64_t buf_size_max, uint32_t threads)
{
	uint64_t bufs_alloc_size;
	uint32_t bufs_count;

	// Set bufs_count and bufs_alloc_size.
	return_if_error(get_options(&bufs_alloc_size, &bufs_count,
			buf_size_max, threads));

	// Allocate memory if needed.
	if (outq->buf_size_max != buf_size_max
			|| outq->bufs_allocated != bufs_count) {
		lzma_outq_end(outq, allocator);

#if SIZE_MAX < UINT64_MAX
		if (bufs_alloc_size > SIZE_MAX)
			return LZMA_MEM_ERROR;
#endif

		outq->bufs = lzma_alloc(bufs_count * sizeof(lzma_outbuf),
				allocator);
		outq->bufs_mem = lzma_alloc((size_t)(bufs_alloc_size),
				allocator);

		if (outq->bufs == NULL || outq->bufs_mem == NULL) {
			lzma_outq_end(outq, allocator);
			return LZMA_MEM_ERROR;
		}
	}

	// Initialize the rest of the main structure. Initialization of
	// outq->bufs[] is done when they are actually needed.
	outq->buf_size_max = (size_t)(buf_size_max);
	outq->bufs_allocated = bufs_count;
	outq->bufs_pos = 0;
	outq->bufs_used = 0;
	outq->read_pos = 0;

	return LZMA_OK;
}